

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O2

void __thiscall Restaurant::start(Restaurant *this)

{
  bool bVar1;
  string *details;
  string action1;
  string delimiter;
  string token;
  undefined1 *local_150;
  undefined8 local_148;
  undefined1 local_140 [16];
  string local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50 [32];
  
  std::operator<<((ostream *)&std::cout,"Restaurant is now open!\n");
  std::__cxx11::string::string(local_130," ",(allocator *)&local_110);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  do {
    local_150 = local_140;
    local_148 = 0;
    local_140[0] = 0;
    std::operator<<((ostream *)&std::cout,"Please enter an Action you want to do: \n");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_150);
    std::__cxx11::string::append((char *)&local_150);
    std::__cxx11::string::find((string *)&local_150,(ulong)local_130);
    std::__cxx11::string::substr((ulong)local_50,(ulong)&local_150);
    std::__cxx11::string::operator=((string *)&local_110,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::erase((ulong)&local_150,0);
    bVar1 = std::operator==(&local_110,"open");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_70,(string *)&local_150);
      goOpen(this,&local_70);
      details = &local_70;
LAB_00107c67:
      std::__cxx11::string::~string((string *)details);
    }
    else {
      bVar1 = std::operator==(&local_110,"order");
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_90,(string *)&local_150);
        details = &local_90;
        goOrder(this,details);
        goto LAB_00107c67;
      }
      bVar1 = std::operator==(&local_110,"move");
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_b0,(string *)&local_150);
        details = &local_b0;
        goMove(this,details);
        goto LAB_00107c67;
      }
      bVar1 = std::operator==(&local_110,"close");
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_d0,(string *)&local_150);
        details = &local_d0;
        goClose(this,details);
        goto LAB_00107c67;
      }
      bVar1 = std::operator==(&local_110,"closeall");
      if (bVar1) {
        goCloseAll(this);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string(local_130);
        return;
      }
      bVar1 = std::operator==(&local_110,"menu");
      if (bVar1) {
        goMenu(this);
      }
      else {
        bVar1 = std::operator==(&local_110,"status");
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_f0,(string *)&local_150);
          details = &local_f0;
          goStatus(this,details);
          goto LAB_00107c67;
        }
        bVar1 = std::operator==(&local_110,"log");
        if (bVar1) {
          goLog(this);
        }
        else {
          bVar1 = std::operator==(&local_110,"backup");
          if (bVar1) {
            goBackup(this);
          }
          else {
            bVar1 = std::operator==(&local_110,"restore");
            if (bVar1) {
              goRestore(this);
            }
            else {
              std::operator<<((ostream *)&std::cout,"Wrong input, try again \n");
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_150);
  } while( true );
}

Assistant:

void Restaurant::start()
{
    std::cout << "Restaurant is now open!\n";
    bool restOpen(true);
    //std::string action;
    std::string delimiter = " ";
    size_t pos = 0;
    std::string token;
    while (restOpen)
    {
        std::string action1;
        std::cout << "Please enter an Action you want to do: \n";
        std::getline(std::cin, action1);
        action1 += " ";
        pos = action1.find(delimiter);
        token = action1.substr(0, pos);
        action1.erase(0, pos + delimiter.length());
        if(token == "open")
            goOpen(action1);
        else if(token == "order")
            goOrder(action1);
        else if(token == "move")
            goMove(action1);
        else if(token == "close")
            goClose(action1);
        else if (token == "closeall") {
            goCloseAll();
            restOpen = false;
        }
        else if (token == "menu")
            goMenu();
        else if (token == "status")
            goStatus(action1);
        else if (token == "log")
            goLog();
        else if (token == "backup")
            goBackup();
        else if (token == "restore")
            goRestore();
        else
            std::cout << "Wrong input, try again \n";
    }
}